

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

Iterator * __thiscall leveldb::MemTable::NewIterator(MemTable *this)

{
  Iterator *this_00;
  
  this_00 = (Iterator *)operator_new(0x58);
  Iterator::Iterator(this_00);
  this_00->_vptr_Iterator = (_func_int **)&PTR__MemTableIterator_001361f8;
  this_00[1]._vptr_Iterator = (_func_int **)&this->table_;
  this_00[1].cleanup_head_.function = (CleanupFunction)0x0;
  this_00[1].cleanup_head_.arg1 = &this_00[1].cleanup_head_.next;
  this_00[1].cleanup_head_.arg2 = (void *)0x0;
  *(undefined1 *)&this_00[1].cleanup_head_.next = 0;
  return this_00;
}

Assistant:

Iterator* MemTable::NewIterator() { return new MemTableIterator(&table_); }